

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_undo.c
# Opt level: O0

_undo_action * canvas_undo_add(_glist *x,t_undo_type type,char *name,void *data)

{
  _undo *p_Var1;
  _undo *udo;
  _undo_action *a;
  void *data_local;
  char *name_local;
  t_undo_type type_local;
  _glist *x_local;
  
  p_Var1 = canvas_undo_get(x);
  if ((((type == UNDO_SEQUENCE_END) && (p_Var1 != (_undo *)0x0)) &&
      (p_Var1->u_last != (_undo_action *)0x0)) && (p_Var1->u_last->type == UNDO_SEQUENCE_START)) {
    p_Var1->u_last = p_Var1->u_last->prev;
    canvas_undo_rebranch(x);
    p_Var1->u_last->next = (_undo_action *)0x0;
    canvas_undo_set_name(p_Var1->u_last->name);
    canvas_show_undomenu(x,p_Var1->u_last->name,"no");
    x_local = (_glist *)0x0;
  }
  else {
    x_local = (_glist *)canvas_undo_init(x);
    if (x_local != (_glist *)0x0) {
      *(t_undo_type *)&(x_local->gl_obj).te_g.g_next = type;
      (x_local->gl_obj).te_binbuf = (_binbuf *)data;
      (x_local->gl_obj).te_outlet = (_outlet *)name;
      canvas_undo_set_name(name);
      canvas_show_undomenu(x,(char *)(x_local->gl_obj).te_outlet,"no");
    }
  }
  return (_undo_action *)x_local;
}

Assistant:

t_undo_action *canvas_undo_add(t_canvas *x, t_undo_type type, const char *name,
    void *data)
{
    t_undo_action *a = 0;
    t_undo * udo = canvas_undo_get(x);
    DEBUG_UNDO(post("%s: %d %s %p!", __FUNCTION__, type, name, data));
    if(UNDO_SEQUENCE_END == type
       && udo && udo->u_last
       && UNDO_SEQUENCE_START == udo->u_last->type)
    {
            /* empty undo sequence...get rid of it */
        udo->u_last = udo->u_last->prev;
        canvas_undo_rebranch(x);
        udo->u_last->next = 0;
        canvas_undo_set_name(udo->u_last->name);
        canvas_show_undomenu(x, udo->u_last->name, "no");
        return 0;
    }

    a = canvas_undo_init(x);
    if(!a)return a;
    a->type = type;
    a->data = (void *)data;
    a->name = (char *)name;
    canvas_undo_set_name(name);
    canvas_show_undomenu(x, a->name, "no");
    DEBUG_UNDO(post("%s: done!", __FUNCTION__));
    return(a);
}